

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

DayOfWeek __thiscall QtPrivate::QCalendarModel::dayOfWeekForColumn(QCalendarModel *this,int column)

{
  DayOfWeek DVar1;
  DayOfWeek DVar2;
  uint uVar3;
  
  uVar3 = column - this->m_firstColumn;
  DVar2 = Sunday;
  if (uVar3 < 7) {
    DVar1 = this->m_firstDay + uVar3;
    DVar2 = (this->m_firstDay - Sunday) + uVar3;
    if ((int)DVar1 < 8) {
      DVar2 = DVar1;
    }
  }
  return DVar2;
}

Assistant:

Qt::DayOfWeek QCalendarModel::dayOfWeekForColumn(int column) const
{
    int col = column - m_firstColumn;
    if (col < 0 || col > 6)
        return Qt::Sunday;
    int day = m_firstDay + col;
    if (day > 7)
        day -= 7;
    return Qt::DayOfWeek(day);
}